

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextGLImpl::Draw(DeviceContextGLImpl *this,DrawAttribs *Attribs)

{
  GLenum local_1c;
  DrawAttribs *pDStack_18;
  GLenum GlTopology;
  DrawAttribs *Attribs_local;
  DeviceContextGLImpl *this_local;
  
  pDStack_18 = Attribs;
  Attribs_local = (DrawAttribs *)this;
  DeviceContextBase<Diligent::EngineGLImplTraits>::Draw
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PrepareForDraw(this,pDStack_18->Flags,false,&local_1c);
  if ((pDStack_18->NumVertices != 0) && (pDStack_18->NumInstances != 0)) {
    DrawArrays(local_1c,pDStack_18->NumVertices,pDStack_18->NumInstances,
               pDStack_18->StartVertexLocation,pDStack_18->FirstInstanceLocation);
  }
  PostDraw(this);
  return;
}

Assistant:

void DeviceContextGLImpl::Draw(const DrawAttribs& Attribs)
{
    TDeviceContextBase::Draw(Attribs, 0);

    GLenum GlTopology;
    PrepareForDraw(Attribs.Flags, false, GlTopology);

    if (Attribs.NumVertices > 0 && Attribs.NumInstances > 0)
    {
        DrawArrays(GlTopology,
                   Attribs.NumVertices,
                   Attribs.NumInstances,
                   Attribs.StartVertexLocation,
                   Attribs.FirstInstanceLocation);
    }

    PostDraw();
}